

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::DescriptorPoolDatabaseTest_PreserveSourceCodeInfo_Test::TestBody
          (DescriptorPoolDatabaseTest_PreserveSourceCodeInfo_Test *this)

{
  bool bVar1;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar2;
  pointer message;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  DescriptorPoolDatabase db;
  SimpleDescriptorDatabase original_db;
  FileDescriptorProto file;
  DescriptorPool pool;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_248;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_238;
  undefined1 local_230 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  AssertHelper local_210;
  DescriptorPoolDatabase local_208;
  SimpleDescriptorDatabase local_1f0;
  FileDescriptorProto local_188;
  DescriptorPool local_90;
  
  SimpleDescriptorDatabase::SimpleDescriptorDatabase(&local_1f0);
  AddToDatabase(&local_1f0,
                "\n    name: \"foo.proto\"\n    package: \"foo\"\n    message_type {\n      name: \"Foo\"\n      extension_range { start: 1 end: 100 }\n    }\n    extension {\n      name: \"foo_ext\"\n      extendee: \".foo.Foo\"\n      number: 3\n      label: LABEL_OPTIONAL\n      type: TYPE_INT32\n    }\n    source_code_info { location { leading_detached_comments: \"comment\" } }\n  "
               );
  DescriptorPool::DescriptorPool
            (&local_90,&local_1f0.super_DescriptorDatabase,(ErrorCollector *)0x0);
  DescriptorPoolDatabase::DescriptorPoolDatabase
            (&local_208,&local_90,(DescriptorPoolDatabaseOptions)0x1);
  FileDescriptorProto::FileDescriptorProto(&local_188,(Arena *)0x0);
  local_230 = (undefined1  [8])&local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"foo.proto","");
  bVar1 = DescriptorPoolDatabase::FindFileByName(&local_208,(StringViewArg)local_230,&local_188);
  local_240._M_head_impl._0_1_ = (internal)bVar1;
  local_238 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_230 != (undefined1  [8])&local_220) {
    operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
  }
  if (local_240._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_230,(internal *)&local_240,
               (AssertionResult *)"db.FindFileByName(\"foo.proto\", &file)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x250,(char *)local_230);
    testing::internal::AssertHelper::operator=(&local_210,(Message *)&local_248);
LAB_0054cea9:
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_238;
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    if (local_230 != (undefined1  [8])&local_220) {
      operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
    }
    if (local_248._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_248._M_head_impl + 8))();
    }
    local_228 = local_238;
    if (local_238 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0054ceeb;
  }
  else {
    if (local_238 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_238,local_238);
    }
    local_240._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10c26a9;
    testing::internal::
    PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
              (local_230,(char *)&local_240,(SourceCodeInfo *)"file.source_code_info()");
    if (local_230[0] == (string)0x0) {
      testing::Message::Message((Message *)&local_240);
      if (local_228 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar2 = (local_228->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_248,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,0x253,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)&local_240);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
      if (local_240._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_240._M_head_impl + 8))();
      }
    }
    if (local_228 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_228,local_228);
    }
    local_230 = (undefined1  [8])&local_220;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"foo.Foo","");
    bVar1 = DescriptorPoolDatabase::FindFileContainingExtension
                      (&local_208,(StringViewArg)local_230,3,&local_188);
    local_240._M_head_impl._0_1_ = (internal)bVar1;
    local_238 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_230 != (undefined1  [8])&local_220) {
      operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
    }
    if (local_240._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_248);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_230,(internal *)&local_240,
                 (AssertionResult *)"db.FindFileContainingExtension(\"foo.Foo\", 3, &file)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_210,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,0x255,(char *)local_230);
      testing::internal::AssertHelper::operator=(&local_210,(Message *)&local_248);
      goto LAB_0054cea9;
    }
    if (local_238 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_238,local_238);
    }
    local_240._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10c26a9;
    testing::internal::
    PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
              (local_230,(char *)&local_240,(SourceCodeInfo *)"file.source_code_info()");
    if (local_230[0] == (string)0x0) {
      testing::Message::Message((Message *)&local_240);
      if (local_228 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar2 = (local_228->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_248,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,600,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)&local_240);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
      if (local_240._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_240._M_head_impl + 8))();
      }
    }
    if (local_228 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_228,local_228);
    }
    local_230 = (undefined1  [8])&local_220;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"foo.Foo","");
    bVar1 = DescriptorPoolDatabase::FindFileContainingSymbol
                      (&local_208,(StringViewArg)local_230,&local_188);
    local_240._M_head_impl._0_1_ = (internal)bVar1;
    local_238 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_230 != (undefined1  [8])&local_220) {
      operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
    }
    if (local_240._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_248);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_230,(internal *)&local_240,
                 (AssertionResult *)"db.FindFileContainingSymbol(\"foo.Foo\", &file)","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_210,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,0x25a,(char *)local_230);
      testing::internal::AssertHelper::operator=(&local_210,(Message *)&local_248);
      goto LAB_0054cea9;
    }
    if (local_238 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_238,local_238);
    }
    local_240._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10c26a9;
    testing::internal::
    PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
              (local_230,(char *)&local_240,(SourceCodeInfo *)"file.source_code_info()");
    if (local_230[0] == (string)0x0) {
      testing::Message::Message((Message *)&local_240);
      if (local_228 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = anon_var_dwarf_a12c75 + 5;
      }
      else {
        message = (local_228->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_248,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,0x25d,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)&local_240);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
      if (local_240._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_240._M_head_impl + 8))();
      }
    }
    if (local_228 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0054ceeb;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_228;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_228);
LAB_0054ceeb:
  FileDescriptorProto::~FileDescriptorProto(&local_188);
  DescriptorPoolDatabase::~DescriptorPoolDatabase(&local_208);
  DescriptorPool::~DescriptorPool(&local_90);
  SimpleDescriptorDatabase::~SimpleDescriptorDatabase(&local_1f0);
  return;
}

Assistant:

TEST(DescriptorPoolDatabaseTest, PreserveSourceCodeInfo) {
  SimpleDescriptorDatabase original_db;
  AddToDatabase(&original_db, R"pb(
    name: "foo.proto"
    package: "foo"
    message_type {
      name: "Foo"
      extension_range { start: 1 end: 100 }
    }
    extension {
      name: "foo_ext"
      extendee: ".foo.Foo"
      number: 3
      label: LABEL_OPTIONAL
      type: TYPE_INT32
    }
    source_code_info { location { leading_detached_comments: "comment" } }
  )pb");
  DescriptorPool pool(&original_db);
  DescriptorPoolDatabase db(
      pool, DescriptorPoolDatabaseOptions{/*preserve_source_code_info=*/true});

  FileDescriptorProto file;
  ASSERT_TRUE(db.FindFileByName("foo.proto", &file));
  EXPECT_THAT(
      file.source_code_info(),
      EqualsProto(R"pb(location { leading_detached_comments: "comment" })pb"));

  ASSERT_TRUE(db.FindFileContainingExtension("foo.Foo", 3, &file));
  EXPECT_THAT(
      file.source_code_info(),
      EqualsProto(R"pb(location { leading_detached_comments: "comment" })pb"));

  ASSERT_TRUE(db.FindFileContainingSymbol("foo.Foo", &file));
  EXPECT_THAT(
      file.source_code_info(),
      EqualsProto(R"pb(location { leading_detached_comments: "comment" })pb"));
}